

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

void __thiscall ON_SubDMeshImpl::SealEdges(ON_SubDMeshImpl *this)

{
  ON_SubDLimitMeshSealEdgeInfo *pOVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  uint grid_side_dex;
  uint grid_side_dex_00;
  long lVar5;
  ulong uVar6;
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> fe_list;
  ON_SubDLimitMeshSealEdgeInfo local_58;
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> local_40;
  
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::ON_SimpleArray
            (&local_40,(ulong)this->m_fragment_count);
  local_58.m_edge_id = 0;
  local_58.m_bits = '\0';
  local_58.m_grid_side_dex = '\0';
  local_58.m_face_edge_count = 0;
  while (this = (ON_SubDMeshImpl *)((ON_SubDMeshFragment *)this)->m_next_fragment,
        local_58.m_fragment = (ON_SubDMeshFragment *)this,
        (ON_SubDMeshFragment *)this != (ON_SubDMeshFragment *)0x0) {
    if (((ON_SubDMeshFragment *)this)->m_face != (ON_SubDFace *)0x0) {
      for (grid_side_dex_00 = 0; this = (ON_SubDMeshImpl *)local_58.m_fragment,
          grid_side_dex_00 != 4; grid_side_dex_00 = grid_side_dex_00 + 1) {
        bVar3 = ON_SubDLimitMeshSealEdgeInfo::SetEdge(&local_58,grid_side_dex_00);
        if (bVar3) {
          ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::Append(&local_40,&local_58);
        }
      }
    }
  }
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::QuickSort
            (&local_40,ON_SubDLimitMeshSealEdgeInfo::CompareEdgeIdBitsFaceId);
  uVar6 = 0;
LAB_0060ba1e:
  do {
    if ((uint)local_40.m_count <= (uint)uVar6) {
      ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::~ON_SimpleArray(&local_40);
      return;
    }
    uVar6 = uVar6 & 0xffffffff;
    pOVar1 = local_40.m_a + uVar6;
    local_58.m_edge_id = pOVar1->m_edge_id;
    local_58.m_bits = pOVar1->m_bits;
    local_58.m_grid_side_dex = pOVar1->m_grid_side_dex;
    local_58.m_face_edge_count = pOVar1->m_face_edge_count;
    local_58.m_fragment = pOVar1->m_fragment;
    uVar2 = local_58._0_8_ & 0xc000000000;
    bVar4 = local_58.m_bits & 0xc0;
    lVar5 = uVar6 * 0x10;
    while( true ) {
      uVar6 = uVar6 + 1;
      if ((uint)local_40.m_count <= uVar6) break;
      if ((local_58.m_edge_id != *(uint *)((long)&local_40.m_a[1].m_edge_id + lVar5)) ||
         ((uVar2 != 0 && (((&local_40.m_a[1].m_bits)[lVar5] & bVar4) == 0)))) goto LAB_0060ba1e;
      ON_SubDLimitMeshSealEdgeInfo::Seal
                (&local_58,
                 (ON_SubDLimitMeshSealEdgeInfo *)((long)&local_40.m_a[1].m_edge_id + lVar5));
      lVar5 = lVar5 + 0x10;
    }
    uVar6 = (ulong)(uint)local_40.m_count;
  } while( true );
}

Assistant:

void ON_SubDMeshImpl::SealEdges()
{
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> fe_list(m_fragment_count);
  ON_SubDLimitMeshSealEdgeInfo fe;
  for (fe.m_fragment = m_first_fragment; nullptr != fe.m_fragment; fe.m_fragment = fe.m_fragment->m_next_fragment)
  {
    if (nullptr == fe.m_fragment->m_face)
      continue;
    for (unsigned int grid_side_dex = 0; grid_side_dex < 4; grid_side_dex++)
    {
      if ( fe.SetEdge(grid_side_dex) )
        fe_list.Append(fe);
    }
  }

  fe_list.QuickSort(ON_SubDLimitMeshSealEdgeInfo::CompareEdgeIdBitsFaceId);
  const unsigned int fe_list_count = fe_list.UnsignedCount();
  unsigned int i0 = 0;
  while ( i0 < fe_list_count )
  {
    fe = fe_list[i0];
    const unsigned char src_half_mask = (fe.m_bits & ON_SubDLimitMeshSealEdgeInfo::Bits::HalfMask);
    for ( i0++; i0 < fe_list_count && fe.m_edge_id == fe_list[i0].m_edge_id; i0++ )
    {
      if (0 != src_half_mask && 0 == (src_half_mask & fe_list[i0].m_bits))
        break; // necessary when all faces attached to an edge are not quads.
      ON_SubDLimitMeshSealEdgeInfo::Seal(fe, fe_list[i0]);
    }
  }
}